

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::init(TextureDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  SurfaceType SVar5;
  pointer pPVar6;
  _Rb_tree_color _Var7;
  char *pcVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  Texture2D *pTVar11;
  RenderTarget *pRVar12;
  long lVar13;
  deUint32 sizedFormat;
  int iVar14;
  int iVar15;
  DataType DVar16;
  Precision precision;
  Precision PVar17;
  int x;
  char *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Vector<float,_4> res;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  TextureFormat local_b8;
  undefined1 local_b0 [12];
  int iStack_a4;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  size_t local_90;
  string local_88;
  undefined1 local_68 [16];
  StringTemplate local_50;
  
  PVar17 = (this->super_TriangleDerivateCase).m_surfaceType;
  local_a0 = (_Base_ptr)local_b0;
  local_b0._0_4_ = _S_red;
  stack0xffffffffffffff58 = (_Base_ptr)0x0;
  local_90 = 0;
  DVar16 = TYPE_FLOAT_VEC4;
  if (PVar17 == PRECISION_HIGHP) {
    DVar16 = TYPE_UINT_VEC4;
  }
  local_98 = local_a0;
  pcVar8 = glu::getDataTypeName(DVar16);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"OUTPUT_TYPE","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b8,(key_type *)local_d8);
  pcVar18 = (char *)pmVar9->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar18,(ulong)pcVar8);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  precision = PVar17;
  if (PVar17 != PRECISION_HIGHP) {
    precision = (this->super_TriangleDerivateCase).m_precision;
  }
  pcVar8 = glu::getPrecisionName(precision);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"OUTPUT_PREC","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b8,(key_type *)local_d8);
  pcVar18 = (char *)pmVar9->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar18,(ulong)pcVar8);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  pcVar8 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"PRECISION","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b8,(key_type *)local_d8);
  pcVar18 = (char *)pmVar9->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar18,(ulong)pcVar8);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  pcVar8 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"DATATYPE","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b8,(key_type *)local_d8);
  pcVar18 = (char *)pmVar9->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar18,(ulong)pcVar8);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  uVar10 = (ulong)*(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (uVar10 < 3) {
    pcVar18 = (&PTR_anon_var_dwarf_23faf0c_021465b8)[uVar10];
  }
  else {
    pcVar18 = (char *)0x0;
  }
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"FUNC","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b8,(key_type *)local_d8);
  pcVar8 = (char *)pmVar9->_M_string_length;
  strlen(pcVar18);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar8,(ulong)pcVar18);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  DVar16 = (this->super_TriangleDerivateCase).m_dataType;
  if (DVar16 == TYPE_FLOAT_VEC3) {
    pcVar18 = ".xyz";
  }
  else if (DVar16 == TYPE_FLOAT_VEC4) {
    pcVar18 = glcts::fixed_sample_locations_values + 1;
  }
  else {
    pcVar18 = ".x";
    if (DVar16 == TYPE_FLOAT_VEC2) {
      pcVar18 = ".xy";
    }
  }
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"SWIZZLE","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b8,(key_type *)local_d8);
  pcVar8 = (char *)pmVar9->_M_string_length;
  strlen(pcVar18);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar8,(ulong)pcVar18);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  DVar16 = (this->super_TriangleDerivateCase).m_dataType;
  if (PVar17 == PRECISION_HIGHP) {
    if (DVar16 == TYPE_FLOAT_VEC3) {
      pcVar18 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar16 == TYPE_FLOAT_VEC4) {
      pcVar18 = "floatBitsToUint(res)";
    }
    else {
      pcVar18 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar16 == TYPE_FLOAT_VEC2) {
        pcVar18 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_d8 = (undefined1  [8])&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CAST_TO_OUTPUT","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_b8,(key_type *)local_d8);
    pcVar8 = (char *)pmVar9->_M_string_length;
    strlen(pcVar18);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar8,(ulong)pcVar18);
  }
  else {
    if (DVar16 == TYPE_FLOAT_VEC3) {
      pcVar18 = "vec4(res, 1.0)";
    }
    else if (DVar16 == TYPE_FLOAT_VEC4) {
      pcVar18 = "res";
    }
    else {
      pcVar18 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar16 == TYPE_FLOAT_VEC2) {
        pcVar18 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_d8 = (undefined1  [8])&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CAST_TO_OUTPUT","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_b8,(key_type *)local_d8);
    pcVar8 = (char *)pmVar9->_M_string_length;
    strlen(pcVar18);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar8,(ulong)pcVar18);
  }
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "#version 300 es\nin highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} sampler2D u_sampler;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_50,&local_88);
  tcu::StringTemplate::specialize
            ((string *)local_d8,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_b8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)local_d8);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_b8);
  PVar17 = (this->super_TriangleDerivateCase).m_precision;
  uVar10 = (ulong)PVar17;
  if (uVar10 < 3) {
    fVar22 = *(float *)(&DAT_01c11a1c + uVar10 * 4);
    fVar28 = *(float *)(&DAT_01c11a28 + uVar10 * 4);
    fVar21 = *(float *)(&DAT_01c11a34 + uVar10 * 4);
    fVar1 = *(float *)(&DAT_01c11a40 + uVar10 * 4);
    fVar2 = *(float *)(&DAT_01c11a4c + uVar10 * 4);
    fVar3 = *(float *)(&DAT_01c11a58 + uVar10 * 4);
    fVar4 = *(float *)(&DAT_01c11a64 + uVar10 * 4);
    (this->m_texValueMin).m_data[0] = *(float *)(&DAT_01c11a10 + uVar10 * 4);
    (this->m_texValueMin).m_data[1] = fVar22;
    (this->m_texValueMin).m_data[2] = fVar28;
    (this->m_texValueMin).m_data[3] = fVar21;
    (this->m_texValueMax).m_data[0] = fVar1;
    (this->m_texValueMax).m_data[1] = fVar2;
    (this->m_texValueMax).m_data[2] = fVar3;
    (this->m_texValueMax).m_data[3] = fVar4;
  }
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar14 = 0xa7;
    if (pRVar12->m_width < 0xa7) {
      iVar14 = pRVar12->m_width;
    }
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar15 = 0x67;
    if (pRVar12->m_height < 0x67) {
      iVar15 = pRVar12->m_height;
    }
    PVar17 = (this->super_TriangleDerivateCase).m_precision;
  }
  else {
    iVar15 = 0x85;
    iVar14 = 99;
  }
  pTVar11 = (Texture2D *)operator_new(0x70);
  sizedFormat = 0x881a;
  if (PVar17 == PRECISION_HIGHP) {
    sizedFormat = 0x8814;
  }
  glu::Texture2D::Texture2D
            (pTVar11,((this->super_TriangleDerivateCase).super_TestCase.m_context)->m_renderCtx,
             sizedFormat,iVar14,iVar15);
  this->m_texture = pTVar11;
  tcu::Texture2D::allocLevel(&pTVar11->m_refTexture,0);
  (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[0] = 1.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[1] = 1.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[2] = 1.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[3] = 1.0;
  pTVar11 = this->m_texture;
  pPVar6 = (pTVar11->m_refTexture).super_TextureLevelPyramid.m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b8 = (pPVar6->super_ConstPixelBufferAccess).m_format;
  lVar13 = 2;
  do {
    *(int *)(&(((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_b8)->_M_impl).field_0x0 + lVar13 * 4) =
         (pPVar6->super_ConstPixelBufferAccess).m_size.m_data[lVar13 + -2];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 5);
  lVar13 = 5;
  do {
    *(int *)(&(((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_b8)->_M_impl).field_0x0 + lVar13 * 4) =
         (pPVar6->super_ConstPixelBufferAccess).m_size.m_data[lVar13 + -2];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 8);
  local_98 = (_Base_ptr)(pPVar6->super_ConstPixelBufferAccess).m_data;
  if (0 < (int)local_b0._4_4_) {
    iVar15 = 0;
    _Var7 = local_b0._0_4_;
    iVar14 = local_b0._4_4_;
    do {
      if (0 < (int)_Var7) {
        local_68 = ZEXT416((uint)((float)iVar15 + 0.5));
        x = 0;
        do {
          auVar19._0_4_ = (float)x + 0.5;
          auVar19._4_4_ = local_68._0_4_;
          auVar19._8_4_ = 0;
          auVar19._12_4_ = local_68._4_4_;
          auVar27._0_4_ = (float)(int)_Var7;
          auVar27._4_4_ = (float)(int)local_b0._4_4_;
          auVar27._8_8_ = 0;
          auVar19 = divps(auVar19,auVar27);
          fVar21 = (auVar19._4_4_ + auVar19._0_4_) * 0.5;
          fVar22 = (this->m_texValueMin).m_data[0];
          fVar28 = (this->m_texValueMin).m_data[1];
          fStack_d0 = (this->m_texValueMin).m_data[2];
          fStack_cc = (this->m_texValueMin).m_data[3];
          fStack_d0 = ((this->m_texValueMax).m_data[2] - fStack_d0) * fVar21 + fStack_d0;
          fStack_cc = ((this->m_texValueMax).m_data[3] - fStack_cc) * (1.0 - fVar21) + fStack_cc;
          local_d8._4_4_ = ((this->m_texValueMax).m_data[1] - fVar28) * auVar19._4_4_ + fVar28;
          local_d8._0_4_ = ((this->m_texValueMax).m_data[0] - fVar22) * auVar19._0_4_ + fVar22;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_b8,(Vec4 *)local_d8,x,iVar15,0);
          x = x + 1;
          _Var7 = local_b0._0_4_;
          iVar14 = local_b0._4_4_;
        } while (x < (int)local_b0._0_4_);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < iVar14);
    pTVar11 = this->m_texture;
  }
  (*pTVar11->_vptr_Texture2D[2])();
  SVar5 = (this->super_TriangleDerivateCase).m_surfaceType;
  if (SVar5 == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar14 = 0xa7;
    if (pRVar12->m_width < 0xa7) {
      iVar14 = pRVar12->m_width;
    }
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar15 = 0x67;
    if (pRVar12->m_height < 0x67) {
      iVar15 = pRVar12->m_height;
    }
    fVar28 = (float)iVar14;
    fVar22 = (float)iVar15;
LAB_0125845e:
    auVar20._0_8_ =
         CONCAT44((this->m_texValueMax).m_data[1] - (this->m_texValueMin).m_data[1],
                  (this->m_texValueMax).m_data[0] - (this->m_texValueMin).m_data[0]);
    auVar20._8_4_ = (this->m_texValueMax).m_data[2] - (this->m_texValueMin).m_data[2];
    auVar20._12_4_ = (this->m_texValueMax).m_data[3] - (this->m_texValueMin).m_data[3];
    auVar29._4_4_ = fVar28;
    auVar29._0_4_ = fVar28;
    auVar29._12_4_ = fVar28 * -0.5;
    auVar29._8_4_ = fVar28 * 0.5;
    auVar26._8_4_ = auVar20._8_4_;
    auVar26._0_8_ = auVar20._0_8_;
    auVar26._12_4_ = auVar20._12_4_;
    auVar27 = divps(auVar26,auVar29);
    auVar23._4_4_ = fVar22;
    auVar23._0_4_ = fVar22;
    auVar23._12_4_ = fVar22 * -0.5;
    auVar23._8_4_ = fVar22 * 0.5;
    auVar19 = divps(auVar20,auVar23);
    iVar14 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
    if (iVar14 == 2) {
      auVar30._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar30._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar30._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar27 = maxps(auVar30,auVar27);
      auVar24._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = auVar19._8_4_ ^ 0x80000000;
      auVar24._12_4_ = auVar19._12_4_ ^ 0x80000000;
      auVar19 = maxps(auVar24,auVar19);
      auVar25._0_4_ = auVar19._0_4_ + auVar27._0_4_;
      auVar25._4_4_ = auVar19._4_4_ + auVar27._4_4_;
      auVar25._8_4_ = auVar19._8_4_ + auVar27._8_4_;
      auVar25._12_4_ = auVar19._12_4_ + auVar27._12_4_;
      auVar19 = divps(_DAT_019fabf0,auVar25);
    }
    else {
      if (iVar14 == 1) {
        auVar19 = divps(_DAT_019fabf0,auVar19);
        *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data = auVar19;
        goto LAB_012584f4;
      }
      if (iVar14 != 0) goto LAB_012584f4;
      auVar19 = divps(_DAT_019fabf0,auVar27);
    }
  }
  else {
    if (SVar5 != SURFACETYPE_FLOAT_FBO) {
      fVar22 = 133.0;
      fVar28 = 99.0;
      goto LAB_0125845e;
    }
    iVar14 = 2;
    auVar19 = _DAT_01a1c5b0;
  }
  *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data = auVar19;
LAB_012584f4:
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = 0.0;
  return iVar14;
}

Assistant:

void TextureDerivateCase::init (void)
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 300 es\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} sampler2D u_sampler;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_func);
		fragmentParams["SWIZZLE"]			= m_dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */					   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
		}

		m_fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Lowp and mediump cases use RGBA16F format, while highp uses RGBA32F.
	{
		const tcu::IVec2 viewportSize = getViewportSize();
		DE_ASSERT(!m_texture);
		m_texture = new glu::Texture2D(m_context.getRenderContext(), m_precision == glu::PRECISION_HIGHP ? GL_RGBA32F : GL_RGBA16F, viewportSize.x(), viewportSize.y());
		m_texture->getRefTexture().allocLevel(0);
	}

	// Texture coordinates
	m_coordMin = tcu::Vec4(0.0f);
	m_coordMax = tcu::Vec4(1.0f);

	// Fill with gradients.
	{
		const tcu::PixelBufferAccess level0 = m_texture->getRefTexture().getLevel(0);
		for (int y = 0; y < level0.getHeight(); y++)
		{
			for (int x = 0; x < level0.getWidth(); x++)
			{
				const float		xf		= (float(x)+0.5f) / float(level0.getWidth());
				const float		yf		= (float(y)+0.5f) / float(level0.getHeight());
				const tcu::Vec4	s		= tcu::Vec4(xf, yf, (xf+yf)/2.0f, 1.0f - (xf+yf)/2.0f);

				level0.setPixel(m_texValueMin + (m_texValueMax - m_texValueMin)*s, x, y);
			}
		}
	}

	m_texture->upload();

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::IVec2	viewportSize	= getViewportSize();
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_texValueMax - m_texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_texValueMax - m_texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}